

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

void ps_parser_init(PS_Parser parser,FT_Byte *base,FT_Byte *limit,FT_Memory memory)

{
  long lVar1;
  PS_Parser_FuncsRec *pPVar2;
  PS_Parser_FuncsRec *pPVar3;
  
  parser->error = 0;
  parser->base = base;
  parser->limit = limit;
  parser->cursor = base;
  parser->memory = memory;
  pPVar2 = &ps_parser_funcs;
  pPVar3 = &parser->funcs;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    pPVar3->init = pPVar2->init;
    pPVar2 = (PS_Parser_FuncsRec *)&pPVar2->done;
    pPVar3 = (PS_Parser_FuncsRec *)&pPVar3->done;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_init( PS_Parser  parser,
                  FT_Byte*   base,
                  FT_Byte*   limit,
                  FT_Memory  memory )
  {
    parser->error  = FT_Err_Ok;
    parser->base   = base;
    parser->limit  = limit;
    parser->cursor = base;
    parser->memory = memory;
    parser->funcs  = ps_parser_funcs;
  }